

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O3

uint32_t labpack_reader_begin_str(labpack_reader_t *reader)

{
  mpack_error_t error;
  uint32_t uVar1;
  char *pcVar2;
  
  if (reader != (labpack_reader_t *)0x0) {
    uVar1 = 0;
    if (reader->status == LABPACK_STATUS_OK) {
      uVar1 = mpack_expect_str(reader->decoder);
      error = reader->decoder->error;
      if (error != mpack_ok) {
        reader->status = LABPACK_STATUS_ERROR_DECODER;
        pcVar2 = labpack_mpack_error_message(error);
        reader->status_message = pcVar2;
      }
    }
    return uVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x1a6,"uint32_t labpack_reader_begin_str(labpack_reader_t *)");
}

Assistant:

uint32_t
labpack_reader_begin_str(labpack_reader_t* reader)
{
    assert(reader);
    uint32_t length = 0;
    if (labpack_reader_is_ok(reader)) {
        length = mpack_expect_str(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return length;
}